

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i18n.hpp
# Opt level: O2

string * __thiscall
I18N::Format<std::__cxx11::string&>
          (string *__return_storage_ptr__,I18N *this,string *id,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  initializer_list<util::variant> __l;
  allocator_type local_71;
  vector<util::variant,_std::allocator<util::variant>_> v;
  undefined1 local_58 [64];
  
  util::variant::variant((variant *)local_58,args);
  __l._M_len = 1;
  __l._M_array = (iterator)local_58;
  std::vector<util::variant,_std::allocator<util::variant>_>::vector(&v,__l,&local_71);
  std::__cxx11::string::~string((string *)(local_58 + 0x10));
  FormatV(__return_storage_ptr__,this,id,&v);
  std::vector<util::variant,_std::allocator<util::variant>_>::~vector(&v);
  return __return_storage_ptr__;
}

Assistant:

std::string Format(const std::string& id, Args&&... args) const
		{
			std::vector<util::variant> v{args...};
			return FormatV(id, std::move(v));
		}